

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_montgomery_double(void)

{
  MontgomeryCurve *wc;
  size_t sVar1;
  MontgomeryPoint *src;
  MontgomeryPoint *pMVar2;
  size_t sVar3;
  
  wc = mcurve();
  sVar1 = (*looplimit)(7);
  if (sVar1 == 0) {
    src = (MontgomeryPoint *)0x0;
  }
  else {
    sVar1 = 0;
    pMVar2 = (MontgomeryPoint *)0x0;
    do {
      src = mpoint(wc,sVar1);
      if (pMVar2 != (MontgomeryPoint *)0x0) {
        ecc_montgomery_point_copy_into(pMVar2,src);
        ecc_montgomery_point_free(src);
        src = pMVar2;
      }
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      pMVar2 = ecc_montgomery_double(src);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      ecc_montgomery_point_free(pMVar2);
      sVar1 = sVar1 + 1;
      sVar3 = (*looplimit)(7);
      pMVar2 = src;
    } while (sVar1 < sVar3);
  }
  ecc_montgomery_point_free(src);
  ecc_montgomery_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_montgomery_double(void)
{
    MontgomeryCurve *wc = mcurve();
    MontgomeryPoint *a = NULL;
    for (size_t i = 0; i < looplimit(7); i++) {
        MontgomeryPoint *A = mpoint(wc, i);
        if (!a) {
            a = A;
        } else {
            ecc_montgomery_point_copy_into(a, A);
            ecc_montgomery_point_free(A);
        }

        log_start();
        MontgomeryPoint *r = ecc_montgomery_double(a);
        log_end();

        ecc_montgomery_point_free(r);
    }
    ecc_montgomery_point_free(a);
    ecc_montgomery_curve_free(wc);
}